

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_SwapBetweenArenasWithAllFieldsSet_Test::TestBody
          (ArenaTest_SwapBetweenArenasWithAllFieldsSet_Test *this)

{
  bool bVar1;
  TestAllTypes *other;
  TestAllTypes *message;
  char *message_00;
  AssertHelper local_1d0;
  Message local_1c8;
  unsigned_long local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  string output;
  TestAllTypes *arena2_message;
  Arena arena2;
  TestAllTypes *arena1_message;
  Arena arena1;
  ArenaTest_SwapBetweenArenasWithAllFieldsSet_Test *this_local;
  
  arena1.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&arena1_message);
  other = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&arena1_message);
  Arena::Arena((Arena *)&arena2_message);
  message = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&arena2_message);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  proto2_unittest::TestAllTypes::Swap(message,other);
  std::__cxx11::string::string((string *)&gtest_ar.message_);
  protobuf::MessageLite::SerializeToString((MessageLite *)message,(string *)&gtest_ar.message_);
  local_1b4 = 0;
  local_1c0 = std::__cxx11::string::size();
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1b0,"0","output.size()",&local_1b4,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x32e,message_00);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  Arena::~Arena((Arena *)&arena2_message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(other);
  Arena::~Arena((Arena *)&arena1_message);
  return;
}

Assistant:

TEST(ArenaTest, SwapBetweenArenasWithAllFieldsSet) {
  Arena arena1;
  TestAllTypes* arena1_message = Arena::Create<TestAllTypes>(&arena1);
  {
    Arena arena2;
    TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
    TestUtil::SetAllFields(arena2_message);
    arena2_message->Swap(arena1_message);
    std::string output;
    arena2_message->SerializeToString(&output);
    EXPECT_EQ(0, output.size());
  }
  TestUtil::ExpectAllFieldsSet(*arena1_message);
}